

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleColor(int count)

{
  float fVar1;
  ImGuiContext *pIVar2;
  value_type *pvVar3;
  ImVec4 *pIVar4;
  ImGuiColMod *backup;
  ImGuiContext *g;
  int count_local;
  
  pIVar2 = GImGui;
  for (g._4_4_ = count; 0 < g._4_4_; g._4_4_ = g._4_4_ + -1) {
    pvVar3 = ImVector<ImGuiColMod>::back(&pIVar2->ColorModifiers);
    pIVar4 = (pIVar2->Style).Colors + pvVar3->Col;
    fVar1 = (pvVar3->BackupValue).y;
    pIVar4->x = (pvVar3->BackupValue).x;
    pIVar4->y = fVar1;
    fVar1 = (pvVar3->BackupValue).w;
    pIVar4->z = (pvVar3->BackupValue).z;
    pIVar4->w = fVar1;
    ImVector<ImGuiColMod>::pop_back(&pIVar2->ColorModifiers);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColMod& backup = g.ColorModifiers.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorModifiers.pop_back();
        count--;
    }
}